

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.hpp
# Opt level: O0

void __thiscall helics::ActionMessage::ActionMessage(ActionMessage *this)

{
  undefined4 *in_RDI;
  SmallBuffer *this_00;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)(in_RDI + 2),(GlobalBrokerId)0x0);
  memset((InterfaceHandle *)(in_RDI + 3),0,4);
  InterfaceHandle::InterfaceHandle((InterfaceHandle *)(in_RDI + 3));
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)(in_RDI + 4),(GlobalBrokerId)0x0);
  this_00 = (SmallBuffer *)(in_RDI + 5);
  memset(this_00,0,4);
  InterfaceHandle::InterfaceHandle((InterfaceHandle *)this_00);
  *(undefined2 *)(in_RDI + 6) = 0;
  *(undefined2 *)((long)in_RDI + 0x1a) = 0;
  in_RDI[7] = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0xc) = 0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  SmallBuffer::SmallBuffer(this_00);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3c5c77);
  return;
}

Assistant:

ActionMessage() noexcept {}